

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMCharacterDataImpl::DOMCharacterDataImpl
          (DOMCharacterDataImpl *this,DOMDocument *doc,XMLCh *dat,XMLSize_t len)

{
  int iVar1;
  DOMBuffer *pDVar2;
  undefined4 extraout_var;
  DOMDocumentImpl *this_00;
  
  this_00 = (DOMDocumentImpl *)&doc[-1].super_DOMNode;
  if (doc == (DOMDocument *)0x0) {
    this_00 = (DOMDocumentImpl *)0x0;
  }
  this->fDoc = this_00;
  pDVar2 = DOMDocumentImpl::popBuffer(this_00,len + 1);
  this->fDataBuf = pDVar2;
  if (pDVar2 == (DOMBuffer *)0x0) {
    iVar1 = (*(this->fDoc->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this->fDoc,0x20);
    DOMBuffer::DOMBuffer((DOMBuffer *)CONCAT44(extraout_var,iVar1),this->fDoc,len + 0xf);
    this->fDataBuf = (DOMBuffer *)CONCAT44(extraout_var,iVar1);
  }
  pDVar2 = this->fDataBuf;
  pDVar2->fIndex = 0;
  if (pDVar2->fCapacity <= len) {
    DOMBuffer::expandCapacity(pDVar2,len,false);
  }
  memcpy(pDVar2->fBuffer,dat,len * 2);
  pDVar2->fIndex = len;
  pDVar2->fBuffer[len] = L'\0';
  return;
}

Assistant:

DOMCharacterDataImpl::
DOMCharacterDataImpl(DOMDocument *doc, const XMLCh* dat, XMLSize_t len)
{
    fDoc = (DOMDocumentImpl*)doc;

    fDataBuf = fDoc->popBuffer(len+1);

    if (!fDataBuf)
        fDataBuf = new (fDoc) DOMBuffer(fDoc, len+15);

    fDataBuf->set(dat, len);
}